

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_streamable<trng::uniform01_dist<double>>(uniform01_dist<double> *d)

{
  StringRef capturedExpression;
  bool bVar1;
  uniform01_dist<double> *in_RDI;
  AssertionHandler catchAssertionHandler;
  uniform01_dist<double> d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffdb8;
  undefined2 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  char *in_stack_fffffffffffffdc0;
  AssertionHandler *this;
  StringRef *macroName;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  param_type *in_stack_fffffffffffffdd8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffde0;
  ExprLhs<bool> *in_stack_fffffffffffffde8;
  AssertionHandler *in_stack_fffffffffffffdf0;
  uniform01_dist<double> local_1ae [22];
  stringstream local_198 [16];
  StringRef local_188 [23];
  param_type local_9;
  uniform01_dist<double> *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  macroName = local_188;
  trng::uniform01_dist<double>::param(local_8);
  trng::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                   (param_type *)macroName);
  trng::operator>>(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  trng::uniform01_dist<double>::uniform01_dist(local_1ae,&local_9);
  operator____catch_sr
            (in_stack_fffffffffffffdc0,
             CONCAT17(in_stack_fffffffffffffdbf,
                      CONCAT16(in_stack_fffffffffffffdbe,
                               CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))));
  this = (AssertionHandler *)&stack0xfffffffffffffde8;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xcd);
  Catch::StringRef::StringRef
            ((StringRef *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             (char *)macroName);
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffde0;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffdd8;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
             macroName,(SourceLineInfo *)this,capturedExpression,
             CONCAT13(in_stack_fffffffffffffdbf,
                      CONCAT12(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdbc)));
  bVar1 = trng::operator==((uniform01_dist<double> *)this,
                           (uniform01_dist<double> *)
                           CONCAT17(in_stack_fffffffffffffdbf,
                                    CONCAT16(in_stack_fffffffffffffdbe,
                                             CONCAT24(in_stack_fffffffffffffdbc,
                                                      in_stack_fffffffffffffdb8))));
  Catch::Decomposer::operator<=
            ((Decomposer *)
             CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffdbe,
                                     CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)))
             ,false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  Catch::AssertionHandler::complete(this);
  Catch::AssertionHandler::~AssertionHandler(this);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}